

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadServiceWrapperBase.cpp
# Opt level: O2

bool __thiscall ThreadServiceWrapperBase::IdleCollect(ThreadServiceWrapperBase *this)

{
  Recycler *this_00;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  BOOL BVar4;
  DWORD DVar5;
  undefined4 *puVar6;
  undefined1 uVar7;
  uint uVar8;
  undefined1 local_48 [8];
  AutoBooleanToggle autoInIdleCollect;
  AutoAddRefReleaseThreadService autoThreadServiceKeepAlive;
  
  autoInIdleCollect._8_8_ = this;
  (*(this->super_ThreadServiceWrapper)._vptr_ThreadServiceWrapper[7])();
  if (this->hasScheduledIdleCollect == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadServiceWrapperBase.cpp"
                       ,0x58,"(hasScheduledIdleCollect)","hasScheduledIdleCollect");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  if ((DAT_0145948a == '\x01') &&
     (bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,IdleCollectPhase), bVar2)) {
    GetCurrentThreadId();
    Output::Print(L"%04X> IdleCollect- reset hasScheduledIdleCollect\n");
    Output::Flush();
  }
  this->hasScheduledIdleCollect = false;
  if ((this->inIdleCollect == false) && (this->threadContext->callRootLevel == 0)) {
    this->shouldScheduleIdleCollectOnExitIdle = false;
    Memory::AutoBooleanToggle::AutoBooleanToggle
              ((AutoBooleanToggle *)local_48,&this->inIdleCollect,true,false);
    this_00 = this->threadContext->recycler;
    iVar3 = (*(this->super_ThreadServiceWrapper)._vptr_ThreadServiceWrapper[6])(this);
    if ((((char)iVar3 != '\0') &&
        (BVar4 = Memory::Recycler::FinishConcurrent<(Memory::CollectionFlags)268959744>(this_00),
        BVar4 != 0)) &&
       (bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,IdleCollectPhase), bVar2)) {
      GetCurrentThreadId();
      Output::Print(L"%04X> Idle callback: finish concurrent\n");
      Output::Flush();
    }
    while (BVar4 = Memory::Recycler::CollectionInProgress(this_00), BVar4 == 0) {
      if (this->needIdleCollect == false) {
        FinishIdleCollect(this,FinishReasonNormal);
        goto LAB_0072863f;
      }
      uVar8 = this->tickCountNextIdleCollection;
      DVar5 = GetTickCount();
      uVar8 = uVar8 - DVar5;
      if (0 < (int)uVar8) {
        ScheduleIdleCollect(this,1000,false);
        bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,IdleCollectPhase);
        if (bVar2) {
          DVar5 = GetCurrentThreadId();
          Output::Print(L"%04X> Idle callback: nop until next collection: %d\n",(ulong)DVar5,
                        (ulong)uVar8);
          Output::Flush();
        }
        goto LAB_0072863f;
      }
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,IdleCollectPhase);
      if (bVar2) {
        DVar5 = GetCurrentThreadId();
        Output::Print(L"%04X> Idle callback: collection: %d\n",(ulong)DVar5,(ulong)uVar8);
        Output::Flush();
      }
      this->needIdleCollect = false;
      Memory::Recycler::CollectNow<(Memory::CollectionFlags)2466254848>(this_00);
    }
    ScheduleIdleCollect(this,1000,true);
LAB_0072863f:
    if (this->shouldScheduleIdleCollectOnExitIdle == true) {
      ScheduleIdleCollect(this,1000,false);
    }
    uVar7 = this->hasScheduledIdleCollect;
    Memory::AutoBooleanToggle::~AutoBooleanToggle((AutoBooleanToggle *)local_48);
  }
  else {
    FinishIdleCollect(this,FinishReasonNormal);
    uVar7 = this->hasScheduledIdleCollect;
  }
  AutoAddRefReleaseThreadService::~AutoAddRefReleaseThreadService
            ((AutoAddRefReleaseThreadService *)&autoInIdleCollect.value);
  return (bool)uVar7;
}

Assistant:

bool ThreadServiceWrapperBase::IdleCollect()
{
    // Tracking service does not AddRef/Release the thread service and only keeps a function pointer and context parameter (this pointer)
    // to execute the IdleCollect callback. It is possible that the tracking service gets destroyed as part of the collection
    // during this IdleCollect. If that happens then we need to make sure ThreadService (which may be owned by the tracking service)
    // is kept alive until this callback completes. Any pending timer is killed in the thread service destructor so we should not get
    // any new callbacks after the thread service is destroyed.
    AutoAddRefReleaseThreadService autoThreadServiceKeepAlive(this);

    Assert(hasScheduledIdleCollect);
    IDLE_COLLECT_VERBOSE_TRACE(_u("IdleCollect- reset hasScheduledIdleCollect\n"));
    hasScheduledIdleCollect = false;

    // Don't do anything and kill the timer if we are called recursively or if we are in script
    if (inIdleCollect || threadContext->IsInScript())
    {
        FinishIdleCollect(FinishReason::FinishReasonNormal);
        return hasScheduledIdleCollect;
    }

    // If during idle collect we determine that we need to schedule another
    // idle collect, this gets flipped to true
    shouldScheduleIdleCollectOnExitIdle = false;

    AutoBooleanToggle autoInIdleCollect(&inIdleCollect);
    Recycler* recycler = threadContext->GetRecycler();
#if ENABLE_CONCURRENT_GC
    // Finish concurrent on timer heart beat if needed
    // We wouldn't try to finish if we need to schedule
    // an idle task to finish the collection
    if (this->ShouldFinishConcurrentCollectOnIdleCallback() && recycler->FinishConcurrent<FinishConcurrentOnIdle>())
    {
        IDLE_COLLECT_TRACE(_u("Idle callback: finish concurrent\n"));
        JS_ETW(EventWriteJSCRIPT_GC_IDLE_CALLBACK_FINISH(this));
    }
#endif

    while (true)
    {
        // If a GC is still happening, just wait for the next heart beat
        if (recycler->CollectionInProgress())
        {
            ScheduleIdleCollect(IdleTicks, true /* schedule as task */);
            break;
        }

        // If there no more need of idle collect, then cancel the timer
        if (!needIdleCollect)
        {
            FinishIdleCollect(FinishReason::FinishReasonNormal);
            break;
        }

        int timeDiff = tickCountNextIdleCollection - GetTickCount();

        // See if we pass the time for the next scheduled Idle GC
        if (timeDiff > 0)
        {
            // Not time yet, wait for the next heart beat
            ScheduleIdleCollect(IdleTicks, false /* not schedule as task */);

            IDLE_COLLECT_TRACE(_u("Idle callback: nop until next collection: %d\n"), timeDiff);
            break;
        }

        // activate an idle collection
        IDLE_COLLECT_TRACE(_u("Idle callback: collection: %d\n"), timeDiff);
        JS_ETW(EventWriteJSCRIPT_GC_IDLE_CALLBACK_NEWCOLLECT(this));

        needIdleCollect = false;
        recycler->CollectNow<CollectOnScriptIdle>();
    }

    if (shouldScheduleIdleCollectOnExitIdle)
    {
        ScheduleIdleCollect(IdleTicks, false /* not schedule as task */);
    }

    return hasScheduledIdleCollect;
}